

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_matrix_sparse_new.cpp
# Opt level: O1

void __thiscall
matrix_sparse_row_test_sparse_accessor_Test::TestBody
          (matrix_sparse_row_test_sparse_accessor_Test *this)

{
  int iVar1;
  pointer piVar2;
  long *plVar3;
  long *plVar4;
  double *pdVar5;
  bool bVar6;
  bool bVar7;
  char cVar8;
  int iVar9;
  long lVar10;
  const_reference_value pdVar11;
  char *pcVar12;
  StringLike<const_char_*> *regex;
  DeathTest *gtest_dt;
  AssertionResult gtest_ar;
  Matrix_Sparse_Row<double,_int> row;
  AssertHelper local_b8;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_b0;
  undefined4 local_a8;
  undefined1 local_a0 [8];
  index_type local_98;
  undefined4 uStack_94;
  MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_78;
  CSR_Data<double,_int> *local_60;
  int *local_58;
  pointer local_50;
  long local_48;
  double *local_40;
  long local_38;
  
  local_60 = &(this->super_matrix_sparse_row_test).csr_data;
  piVar2 = (this->super_matrix_sparse_row_test).csr_data.row_offset.
           super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
  local_58 = piVar2 + 2;
  lVar10 = (long)piVar2[2];
  local_50 = (this->super_matrix_sparse_row_test).csr_data.i_column.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             + lVar10;
  local_48 = piVar2[3] - lVar10;
  local_40 = (this->super_matrix_sparse_row_test).csr_data.value.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start + lVar10;
  iVar1 = (this->super_matrix_sparse_row_test).csr_data.row_offset.
          super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
          [-1];
  local_a8 = 1;
  local_b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60;
  local_38 = local_48;
  pdVar11 = Disa::Matrix_Sparse_Row::SparseAccessor::operator_cast_to_double_
                      ((SparseAccessor *)&local_b0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_a0,"row[1]","3.0",*pdVar11,3.0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,local_98) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_94,local_98);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x12e,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((*(CSR_Data<double,_int> **)local_b0._M_head_impl)->row_offset).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,local_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,local_98));
  }
  bVar6 = testing::internal::AlwaysTrue();
  if (bVar6) {
    local_b0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x147416;
    testing::ContainsRegex<char_const*>
              ((PolymorphicMatcher<testing::internal::MatchesRegexMatcher> *)local_a0,
               (testing *)&local_b0,regex);
    testing::PolymorphicMatcher::operator_cast_to_Matcher
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&local_78,(PolymorphicMatcher *)local_a0);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_94,local_98) !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)CONCAT44(uStack_94,local_98));
    }
    bVar7 = testing::internal::DeathTest::Create
                      ("force_read = row[0]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&local_78,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
                       ,0x132,(DeathTest **)&local_b8);
    testing::internal::
    MatcherBase<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~MatcherBase(&local_78);
    bVar6 = true;
    if (bVar7) {
      plVar3 = (long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_);
      if (plVar3 != (long *)0x0) {
        iVar9 = (**(code **)(*plVar3 + 0x10))(plVar3);
        if (iVar9 == 0) {
          plVar4 = (long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_);
          iVar9 = (**(code **)(*plVar4 + 0x18))(plVar4);
          bVar6 = testing::internal::ExitedUnsuccessfully(iVar9);
          cVar8 = (**(code **)(*plVar4 + 0x20))(plVar4,bVar6);
          if (cVar8 != '\0') goto LAB_00111ed1;
          bVar6 = true;
          bVar7 = false;
        }
        else {
          if (iVar9 == 1) {
            plVar4 = (long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_);
            bVar6 = testing::internal::AlwaysTrue();
            if (bVar6) {
              local_98 = 0;
              local_a0 = (undefined1  [8])&local_60;
              Disa::Matrix_Sparse_Row::SparseAccessor::operator_cast_to_double_
                        ((SparseAccessor *)local_a0);
            }
            (**(code **)(*(long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_) + 0x28))
                      ((long *)CONCAT44(local_b8.data_._4_4_,local_b8.data_._0_4_),2);
            (**(code **)(*plVar4 + 0x28))(plVar4,0);
          }
LAB_00111ed1:
          bVar6 = false;
          bVar7 = true;
        }
        (**(code **)(*plVar3 + 8))(plVar3);
        if (!bVar7) goto LAB_00111ee8;
      }
      bVar6 = false;
    }
LAB_00111ee8:
    if (!bVar6) goto LAB_00111f43;
  }
  testing::Message::Message((Message *)local_a0);
  pcVar12 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&local_b0,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
             ,0x132,pcVar12);
  testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)local_a0);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
  if (local_a0 != (undefined1  [8])0x0) {
    (*(code *)((*(CSR_Data<double,_int> **)local_a0)->row_offset).
              super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
              _M_finish)();
  }
LAB_00111f43:
  local_b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4024000000000000
  ;
  local_98 = 3;
  local_a0 = (undefined1  [8])&local_60;
  Disa::Matrix_Sparse_Row<double,_int>::SparseAccessor::operator=
            ((SparseAccessor *)local_a0,(const_reference_value)&local_b0);
  local_a8 = 3;
  local_b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60;
  pdVar11 = Disa::Matrix_Sparse_Row::SparseAccessor::operator_cast_to_double_
                      ((SparseAccessor *)&local_b0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_a0,"row[3]","10.0",*pdVar11,10.0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,local_98) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_94,local_98);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x136,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((*(CSR_Data<double,_int> **)local_b0._M_head_impl)->row_offset).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,local_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,local_98));
  }
  local_b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x4020000000000000
  ;
  local_98 = 2;
  local_a0 = (undefined1  [8])&local_60;
  Disa::Matrix_Sparse_Row<double,_int>::SparseAccessor::operator=
            ((SparseAccessor *)local_a0,(const_reference_value)&local_b0);
  local_a8 = 2;
  local_b0._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60;
  pdVar11 = Disa::Matrix_Sparse_Row::SparseAccessor::operator_cast_to_double_
                      ((SparseAccessor *)&local_b0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_a0,"row[2]","8.0",*pdVar11,8.0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,local_98) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_94,local_98);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x13a,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (*(code *)((*(CSR_Data<double,_int> **)local_b0._M_head_impl)->row_offset).
                super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                _M_finish)();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,local_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,local_98));
  }
  local_b0._M_head_impl._0_4_ = local_58[1];
  local_b8.data_._0_4_ = 6;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a0,"row.row_offset()","6",(int *)&local_b0,(int *)&local_b8);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,local_98) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_94,local_98);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x13d,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,local_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,local_98));
  }
  local_b0._M_head_impl._0_4_ = local_58[1] - *local_58;
  local_b8.data_._0_4_ = 4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a0,"row.size_non_zero()","4",(int *)&local_b0,(int *)&local_b8);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,local_98) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_94,local_98);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x13e,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,local_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,local_98));
  }
  local_b0._M_head_impl._0_4_ = iVar1 + 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a0,"csr_data.row_offset.back()","initial_offset + 1",
             (this->super_matrix_sparse_row_test).csr_data.row_offset.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             + -1,(int *)&local_b0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,local_98) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_94,local_98);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x13f,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,local_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,local_98));
  }
  pdVar5 = local_40;
  piVar2 = local_50;
  local_b0._M_head_impl._0_4_ = 1;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a0,"(*it).i_column()","1",local_50,(int *)&local_b0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,local_98) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_94,local_98);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x142,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,local_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,local_98));
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_a0,"(*it).value()","3.0",*pdVar5,3.0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,local_98) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_94,local_98);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x143,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,local_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,local_98));
  }
  local_b0._M_head_impl._0_4_ = 2;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a0,"(*it).i_column()","2",piVar2 + 1,(int *)&local_b0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,local_98) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_94,local_98);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x145,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,local_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,local_98));
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_a0,"(*it).value()","8.0",pdVar5[1],8.0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,local_98) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_94,local_98);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x146,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,local_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,local_98));
  }
  local_b0._M_head_impl._0_4_ = 3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a0,"(*it).i_column()","3",piVar2 + 2,(int *)&local_b0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,local_98) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_94,local_98);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x148,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,local_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,local_98));
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_a0,"(*it).value()","10.0",pdVar5[2],10.0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,local_98) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_94,local_98);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x149,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,local_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,local_98));
  }
  local_b0._M_head_impl._0_4_ = 4;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)local_a0,"(*it).i_column()","4",piVar2 + 3,(int *)&local_b0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,local_98) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_94,local_98);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x14b,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,local_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,local_98));
  }
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)local_a0,"(*it).value()","5.0",pdVar5[3],5.0);
  if (local_a0[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_b0);
    if ((undefined8 *)CONCAT44(uStack_94,local_98) == (undefined8 *)0x0) {
      pcVar12 = "";
    }
    else {
      pcVar12 = *(char **)CONCAT44(uStack_94,local_98);
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/core/test_matrix_sparse_new.cpp"
               ,0x14c,pcVar12);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_b0._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_b0._M_head_impl + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(uStack_94,local_98) !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_98,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uStack_94,local_98));
  }
  return;
}

Assistant:

TEST_F(matrix_sparse_row_test, sparse_accessor) {
  Matrix_Sparse_Row<double, int> row(&csr_data, csr_data.row_offset.begin() + 2);
  const int initial_offset = csr_data.row_offset.back();
  // Read existing element
  EXPECT_DOUBLE_EQ(row[1], 3.0);

  // Death on 'read' like operation of non existing column.
  double force_read;
  EXPECT_DEATH(force_read = row[0], "./*");

  // Modify existing element
  row[3] = 10.0;
  EXPECT_DOUBLE_EQ(row[3], 10.0);

  // Insert new element
  row[2] = 8.0;
  EXPECT_DOUBLE_EQ(row[2], 8.0);

  // Verify row properties after modification
  EXPECT_EQ(row.row_offset(), 6);                             // added one entry
  EXPECT_EQ(row.size_non_zero(), 4);                          // added one entry
  EXPECT_EQ(csr_data.row_offset.back(), initial_offset + 1);  // added one entry

  auto it = row.begin();
  EXPECT_EQ((*it).i_column(), 1);
  EXPECT_DOUBLE_EQ((*it).value(), 3.0);
  ++it;
  EXPECT_EQ((*it).i_column(), 2);
  EXPECT_DOUBLE_EQ((*it).value(), 8.0);
  ++it;
  EXPECT_EQ((*it).i_column(), 3);
  EXPECT_DOUBLE_EQ((*it).value(), 10.0);
  ++it;
  EXPECT_EQ((*it).i_column(), 4);
  EXPECT_DOUBLE_EQ((*it).value(), 5.0);
}